

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  bool bVar1;
  SQObjectValue SVar2;
  SQObjectPtr t;
  SQObjectPtr local_18;
  
  local_18.super_SQObject._type = OT_NULL;
  local_18.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = SQTable::GetStr(this->_keywords,s,len,&local_18);
  SVar2.nInteger = 0x102;
  if (bVar1) {
    SVar2 = local_18.super_SQObject._unVal;
  }
  SQObjectPtr::~SQObjectPtr(&local_18);
  return (SQInteger)SVar2.pTable;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}